

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxBoxDetector.cpp
# Opt level: O1

void __thiscall
cbtBoxBoxDetector::getClosestPoints
          (cbtBoxBoxDetector *this,ClosestPointInput *input,Result *output,cbtIDebugDraw *param_3,
          bool param_4)

{
  float fVar1;
  ulong uVar2;
  cbtBoxShape *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int return_code;
  cbtScalar depth;
  dMatrix3 R2;
  dMatrix3 R1;
  cbtVector3 normal;
  dContactGeom *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff00;
  int local_c0;
  cbtScalar local_bc;
  cbtScalar local_b8 [24];
  cbtVector3 local_58;
  cbtVector3 local_48;
  cbtVector3 local_38;
  
  lVar6 = 0;
  do {
    *(undefined4 *)((long)local_b8 + lVar6 + 0x30) =
         *(undefined4 *)((long)(input->m_transformA).m_basis.m_el[0].m_floats + lVar6);
    *(undefined4 *)((long)local_b8 + lVar6) =
         *(undefined4 *)((long)(input->m_transformB).m_basis.m_el[0].m_floats + lVar6);
    *(undefined4 *)((long)local_b8 + lVar6 + 0x34) =
         *(undefined4 *)((long)(input->m_transformA).m_basis.m_el[0].m_floats + lVar6 + 4);
    *(undefined4 *)((long)local_b8 + lVar6 + 4) =
         *(undefined4 *)((long)(input->m_transformB).m_basis.m_el[0].m_floats + lVar6 + 4);
    *(undefined4 *)((long)local_b8 + lVar6 + 0x38) =
         *(undefined4 *)((long)(input->m_transformA).m_basis.m_el[0].m_floats + lVar6 + 8);
    *(undefined4 *)((long)local_b8 + lVar6 + 8) =
         *(undefined4 *)((long)(input->m_transformB).m_basis.m_el[0].m_floats + lVar6 + 8);
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x30);
  pcVar3 = this->m_box1;
  uVar2 = *(ulong *)(pcVar3->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
                    m_implicitShapeDimensions.m_floats;
  fVar1 = (pcVar3->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
          m_implicitShapeDimensions.m_floats[2];
  fVar7 = fVar1;
  (*(pcVar3->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(pcVar3);
  fVar8 = fVar7;
  (*(pcVar3->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(pcVar3);
  fVar9 = fVar8;
  (*(pcVar3->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(pcVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar2;
  fVar7 = (float)uVar2 + fVar7;
  auVar4 = vmovshdup_avx(auVar4);
  fVar8 = auVar4._0_4_ + fVar8;
  fVar9 = fVar9 + fVar1;
  auVar4 = vinsertps_avx(ZEXT416((uint)(fVar7 + fVar7)),ZEXT416((uint)(fVar8 + fVar8)),0x10);
  local_48.m_floats = (cbtScalar  [4])vinsertps_avx(auVar4,ZEXT416((uint)(fVar9 + fVar9)),0x28);
  pcVar3 = this->m_box2;
  uVar2 = *(ulong *)(pcVar3->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
                    m_implicitShapeDimensions.m_floats;
  fVar1 = (pcVar3->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
          m_implicitShapeDimensions.m_floats[2];
  fVar7 = fVar1;
  (*(pcVar3->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(pcVar3);
  fVar8 = fVar7;
  (*(pcVar3->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(pcVar3);
  fVar9 = fVar8;
  (*(pcVar3->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(pcVar3);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar2;
  fVar7 = (float)uVar2 + fVar7;
  auVar4 = vmovshdup_avx(auVar5);
  fVar8 = auVar4._0_4_ + fVar8;
  fVar9 = fVar9 + fVar1;
  auVar4 = vinsertps_avx(ZEXT416((uint)(fVar7 + fVar7)),ZEXT416((uint)(fVar8 + fVar8)),0x10);
  local_58.m_floats = (cbtScalar  [4])vinsertps_avx(auVar4,ZEXT416((uint)(fVar9 + fVar9)),0x28);
  dBoxBox2(&(input->m_transformA).m_origin,local_b8 + 0xc,&local_48,&(input->m_transformB).m_origin,
           local_b8,&local_58,&local_38,&local_bc,&local_c0,4,in_stack_fffffffffffffef8,
           in_stack_ffffffffffffff00,output);
  return;
}

Assistant:

void cbtBoxBoxDetector::getClosestPoints(const ClosestPointInput& input, Result& output, class cbtIDebugDraw* /*debugDraw*/, bool /*swapResults*/)
{
	const cbtTransform& transformA = input.m_transformA;
	const cbtTransform& transformB = input.m_transformB;

	int skip = 0;
	dContactGeom* contact = 0;

	dMatrix3 R1;
	dMatrix3 R2;

	for (int j = 0; j < 3; j++)
	{
		R1[0 + 4 * j] = transformA.getBasis()[j].x();
		R2[0 + 4 * j] = transformB.getBasis()[j].x();

		R1[1 + 4 * j] = transformA.getBasis()[j].y();
		R2[1 + 4 * j] = transformB.getBasis()[j].y();

		R1[2 + 4 * j] = transformA.getBasis()[j].z();
		R2[2 + 4 * j] = transformB.getBasis()[j].z();
	}

	cbtVector3 normal;
	cbtScalar depth;
	int return_code;
	int maxc = 4;

	dBoxBox2(transformA.getOrigin(),
			 R1,
			 2.f * m_box1->getHalfExtentsWithMargin(),
			 transformB.getOrigin(),
			 R2,
			 2.f * m_box2->getHalfExtentsWithMargin(),
			 normal, &depth, &return_code,
			 maxc, contact, skip,
			 output);
}